

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int set_file_identifier(uchar *bp,int from,int to,vdc vdc,archive_write *a,vdd *vdd,
                       archive_string *id,char *label,int leading_under,char_type char_type)

{
  isoent *piVar1;
  int local_154;
  ulong uStack_150;
  int r;
  size_t len;
  char *ids;
  isoent *isoent;
  char identifier [256];
  vdd *vdd_local;
  archive_write *a_local;
  vdc vdc_local;
  int to_local;
  int from_local;
  uchar *bp_local;
  
  identifier._248_8_ = vdd;
  if (((id->length == 0) || (leading_under == 0)) || (*id->s == '_')) {
    if (id->length == 0) {
      if (char_type == A_CHAR) {
        local_154 = set_str_a_characters_bp(a,bp,from,to,(char *)0x0,vdc);
      }
      else {
        local_154 = set_str_d_characters_bp(a,bp,from,to,(char *)0x0,vdc);
      }
    }
    else {
      len = (size_t)id->s;
      if (leading_under != 0) {
        len = len + 1;
      }
      piVar1 = isoent_find_entry(vdd->rootent,(char *)len);
      if (piVar1 == (isoent *)0x0) {
        archive_set_error(&a->archive,-1,"Not Found %s `%s\'.",label,len);
        return -0x1e;
      }
      uStack_150 = (ulong)(piVar1->ext_off + piVar1->ext_len);
      if (*(int *)(identifier._248_8_ + 8) == 1) {
        if (0xfe < uStack_150) {
          uStack_150 = 0xfe;
        }
      }
      else if (0xff < uStack_150) {
        uStack_150 = 0xff;
      }
      memcpy(&isoent,piVar1->identifier,uStack_150);
      identifier[uStack_150 - 8] = '\0';
      a_local._4_4_ = vdc;
      if (*(int *)(identifier._248_8_ + 8) == 1) {
        identifier[uStack_150 - 7] = '\0';
        a_local._4_4_ = VDC_UCS2_DIRECT;
      }
      if (char_type == A_CHAR) {
        local_154 = set_str_a_characters_bp(a,bp,from,to,(char *)&isoent,a_local._4_4_);
      }
      else {
        local_154 = set_str_d_characters_bp(a,bp,from,to,(char *)&isoent,a_local._4_4_);
      }
    }
  }
  else if (char_type == A_CHAR) {
    local_154 = set_str_a_characters_bp(a,bp,from,to,id->s,vdc);
  }
  else {
    local_154 = set_str_d_characters_bp(a,bp,from,to,id->s,vdc);
  }
  return local_154;
}

Assistant:

static int
set_file_identifier(unsigned char *bp, int from, int to, enum vdc vdc,
    struct archive_write *a, struct vdd *vdd, struct archive_string *id,
    const char *label, int leading_under, enum char_type char_type)
{
	char identifier[256];
	struct isoent *isoent;
	const char *ids;
	size_t len;
	int r;

	if (id->length > 0 && leading_under && id->s[0] != '_') {
		if (char_type == A_CHAR)
			r = set_str_a_characters_bp(a, bp, from, to, id->s, vdc);
		else
			r = set_str_d_characters_bp(a, bp, from, to, id->s, vdc);
	} else if (id->length > 0) {
		ids = id->s;
		if (leading_under)
			ids++;
		isoent = isoent_find_entry(vdd->rootent, ids);
		if (isoent == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Not Found %s `%s'.",
			    label, ids);
			return (ARCHIVE_FATAL);
		}
		len = isoent->ext_off + isoent->ext_len;
		if (vdd->vdd_type == VDD_JOLIET) {
			if (len > sizeof(identifier)-2)
				len = sizeof(identifier)-2;
		} else {
			if (len > sizeof(identifier)-1)
				len = sizeof(identifier)-1;
		}
		memcpy(identifier, isoent->identifier, len);
		identifier[len] = '\0';
		if (vdd->vdd_type == VDD_JOLIET) {
			identifier[len+1] = 0;
			vdc = VDC_UCS2_DIRECT;
		}
		if (char_type == A_CHAR)
			r = set_str_a_characters_bp(a, bp, from, to,
			    identifier, vdc);
		else
			r = set_str_d_characters_bp(a, bp, from, to,
			    identifier, vdc);
	} else {
		if (char_type == A_CHAR)
			r = set_str_a_characters_bp(a, bp, from, to, NULL, vdc);
		else
			r = set_str_d_characters_bp(a, bp, from, to, NULL, vdc);
	}
	return (r);
}